

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_interpolate_face
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT new_node)

{
  int iVar1;
  uint uVar2;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  REF_STATUS RVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  REF_DBL log_m [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  
  if ((((((node0 < 0) || (iVar1 = ref_node->max, iVar1 <= node0)) || (iVar1 <= node1)) ||
       ((node1 < 0 || (pRVar3 = ref_node->global, pRVar3[(uint)node0] < 0)))) ||
      ((iVar1 <= node2 || ((node2 < 0 || (pRVar3[(uint)node1] < 0)))))) || (pRVar3[(uint)node2] < 0)
     ) {
    pcVar12 = "node invalid";
    RVar5 = 3;
    uVar8 = 0xa5c;
  }
  else {
    pRVar4 = ref_node->real;
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      pRVar4[new_node * 0xf + lVar10] =
           (pRVar4[(ulong)(uint)(node0 * 0xf) + lVar10] +
            pRVar4[(ulong)(uint)(node1 * 0xf) + lVar10] +
           pRVar4[(ulong)(uint)(node2 * 0xf) + lVar10]) * 0.3333333333333333;
    }
    uVar2 = ref_node->naux;
    lVar10 = (long)(int)(uVar2 * new_node);
    lVar6 = (long)(int)(uVar2 * node2);
    lVar7 = (long)(int)(uVar2 * node1);
    lVar9 = (long)(int)(uVar2 * node0);
    uVar11 = 0;
    if (0 < (int)uVar2) {
      uVar11 = (ulong)uVar2;
    }
    while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
      pRVar4 = ref_node->aux;
      pRVar4[lVar10] = (pRVar4[lVar9] + pRVar4[lVar7] + pRVar4[lVar6]) * 0.3333333333333333;
      lVar10 = lVar10 + 1;
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 1;
    }
    ref_node_metric_get_log(ref_node,node0,log_m0);
    ref_node_metric_get_log(ref_node,node1,log_m1);
    ref_node_metric_get_log(ref_node,node2,log_m2);
    for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
      log_m[lVar10] = (log_m0[lVar10] + log_m1[lVar10] + log_m2[lVar10]) * 0.3333333333333333;
    }
    RVar5 = ref_node_metric_set_log(ref_node,new_node,log_m);
    if (RVar5 == 0) {
      return 0;
    }
    pcVar12 = "log new";
    uVar8 = 0xa71;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
         "ref_node_interpolate_face",RVar5,pcVar12);
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_node_interpolate_face(REF_NODE ref_node, REF_INT node0,
                                             REF_INT node1, REF_INT node2,
                                             REF_INT new_node) {
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m[6];
  REF_INT i;

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1) ||
      !ref_node_valid(ref_node, node2))
    RSS(REF_INVALID, "node invalid");

  for (i = 0; i < 3; i++)
    ref_node_xyz(ref_node, i, new_node) =
        (1.0 / 3.0) *
        (ref_node_xyz(ref_node, i, node0) + ref_node_xyz(ref_node, i, node1) +
         ref_node_xyz(ref_node, i, node2));

  for (i = 0; i < ref_node_naux(ref_node); i++)
    ref_node_aux(ref_node, i, new_node) =
        (1.0 / 3.0) *
        (ref_node_aux(ref_node, i, node0) + ref_node_aux(ref_node, i, node1) +
         ref_node_aux(ref_node, i, node2));

  RSS(ref_node_metric_get_log(ref_node, node0, log_m0), "log 0");
  RSS(ref_node_metric_get_log(ref_node, node1, log_m1), "log 1");
  RSS(ref_node_metric_get_log(ref_node, node2, log_m2), "log 2");

  for (i = 0; i < 6; i++)
    log_m[i] = (1.0 / 3.0) * (log_m0[i] + log_m1[i] + log_m2[i]);

  RSS(ref_node_metric_set_log(ref_node, new_node, log_m), "log new");

  return REF_SUCCESS;
}